

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

bool __thiscall ON_XMLNode::RemoveChild(ON_XMLNode *this,ON_XMLNode *child)

{
  ON_XMLNode *pOVar1;
  ON_XMLNode *detach;
  ON_XMLNode *child_local;
  ON_XMLNode *this_local;
  
  if (child == (ON_XMLNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pOVar1 = ON_XMLNodePrivate::DetachChild(this->_private,child);
    if (pOVar1 == (ON_XMLNode *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      if (pOVar1 != (ON_XMLNode *)0x0) {
        (*pOVar1->_vptr_ON_XMLNode[1])();
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_XMLNode::RemoveChild(ON_XMLNode* child)
{
  if (nullptr == child)
    return false;

  ON_XMLNode* detach = _private->DetachChild(*child);
  if (nullptr != detach)
  {
    delete detach;
    return true;
  }

  return false;
}